

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  ulong local_168;
  size_t i;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  res;
  undefined1 local_118 [8];
  Graph g;
  allocator<std::pair<unsigned_long,_unsigned_long>_> local_e1;
  int local_e0 [14];
  pair<unsigned_long,_unsigned_long> local_a8;
  pair<unsigned_long,_unsigned_long> local_98;
  pair<unsigned_long,_unsigned_long> local_88;
  pair<unsigned_long,_unsigned_long> local_78;
  pair<unsigned_long,_unsigned_long> local_68;
  pair<unsigned_long,_unsigned_long> local_58;
  pair<unsigned_long,_unsigned_long> local_48;
  pair<unsigned_long,_unsigned_long> *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  data;
  
  data.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_e0[0xd] = 0;
  local_e0[0xc] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_a8,local_e0 + 0xd,local_e0 + 0xc);
  local_e0[0xb] = 0;
  local_e0[10] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_98,local_e0 + 0xb,local_e0 + 10);
  local_e0[9] = 0;
  local_e0[8] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_88,local_e0 + 9,local_e0 + 8)
  ;
  local_e0[7] = 1;
  local_e0[6] = 2;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_78,local_e0 + 7,local_e0 + 6)
  ;
  local_e0[5] = 1;
  local_e0[4] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_68,local_e0 + 5,local_e0 + 4)
  ;
  local_e0[3] = 2;
  local_e0[2] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_58,local_e0 + 3,local_e0 + 2)
  ;
  local_e0[1] = 3;
  local_e0[0] = 4;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_48,local_e0 + 1,local_e0);
  local_30 = 7;
  local_38 = &local_a8;
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator(&local_e1);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)local_28,__l,&local_e1);
  std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator(&local_e1);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&res.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
           (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)local_28);
  Graph::Graph((Graph *)local_118,
               (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&res.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,5);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&res.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  Graph::color((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&i,(Graph *)local_118,3);
  local_168 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
    if (sVar2 <= local_168) break;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_168);
    poVar3 = std::operator<<(poVar3," : ");
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,local_168);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_168 = local_168 + 1;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  if (!bVar1) {
    std::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~pair((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)&i);
    Graph::~Graph((Graph *)local_118);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_28);
    return data.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  abort();
}

Assistant:

int main() {
    std::vector<std::pair<size_t, size_t>> data = {
            {0, 1},
            {0, 2},
            {0, 3},
            {1, 2},
            {1, 3},
            {2, 4},
            {3, 4},
    };
    auto g = Graph(data, 5);
    auto res = g.color(3);
    for (size_t i = 0; i < res.first.size(); ++i) {
        std::cout << i << " : " << res.first[i] << std::endl;
    }
    if (res.first.empty()) abort();
}